

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::WriteToMultipleSSBOCase::iterate
          (WriteToMultipleSSBOCase *this)

{
  size_type *this_00;
  ostringstream *this_01;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestError *pTVar6;
  deUint32 dVar7;
  uint size;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  allocator<char> local_5e9;
  deUint32 ref;
  deUint32 res;
  uint local_5e0;
  allocator<char> local_5da;
  allocator<char> local_5d9;
  BufferMemMap bufMap;
  Buffer outputBuffer1;
  Buffer outputBuffer0;
  string local_590;
  string local_570;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  InterfaceVariableInfo value1Info;
  InterfaceVariableInfo value0Info;
  ShaderProgram program;
  undefined1 local_320 [176];
  pointer local_270;
  undefined1 uStack_268;
  undefined7 uStack_267;
  undefined1 uStack_260;
  undefined8 uStack_25f;
  ostringstream src;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(version);
  poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout (local_size_x = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->m_localSize).m_data[0]);
  poVar5 = std::operator<<(poVar5,", local_size_y = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->m_localSize).m_data[1]);
  poVar5 = std::operator<<(poVar5,", local_size_z = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->m_localSize).m_data[2]);
  poVar5 = std::operator<<(poVar5,") in;\n");
  poVar5 = std::operator<<(poVar5,"layout(binding = 0) buffer Out0 {\n");
  poVar5 = std::operator<<(poVar5,"    uint values[");
  if (this->m_isSized == true) {
    de::toString<int>((string *)local_320,&this->m_numValues);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_320,glcts::fixed_sample_locations_values + 1,&local_5d9);
  }
  poVar5 = std::operator<<(poVar5,(string *)local_320);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"} sb_out0;\n");
  poVar5 = std::operator<<(poVar5,"layout(binding = 1) buffer Out1 {\n");
  poVar5 = std::operator<<(poVar5,"    uint values[");
  if (this->m_isSized == true) {
    de::toString<int>((string *)&program,&this->m_numValues);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,glcts::fixed_sample_locations_values + 1,&local_5da);
  }
  poVar5 = std::operator<<(poVar5,(string *)&program);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"} sb_out1;\n");
  poVar5 = std::operator<<(poVar5,"void main (void) {\n");
  poVar5 = std::operator<<(poVar5,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar5 = std::operator<<(poVar5,
                           "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    {\n");
  poVar5 = std::operator<<(poVar5,
                           "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar5 = std::operator<<(poVar5,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar5 = std::operator<<(poVar5,"            sb_out0.values[offset + ndx] = offset + ndx;\n");
  poVar5 = std::operator<<(poVar5,"    }\n");
  poVar5 = std::operator<<(poVar5,"    {\n");
  poVar5 = std::operator<<(poVar5,
                           "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar5 = std::operator<<(poVar5,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar5 = std::operator<<(poVar5,
                           "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
                          );
  poVar5 = std::operator<<(poVar5,"    }\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)local_320);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_320,0,0xac);
  local_270 = (pointer)0x0;
  uStack_268 = 0;
  uStack_267 = 0;
  uStack_260 = 0;
  uStack_25f = 0;
  std::__cxx11::stringbuf::str();
  this_00 = &value0Info.name._M_string_length;
  value0Info.name._M_dataplus._M_p._0_4_ = 5;
  std::__cxx11::string::string((string *)this_00,(string *)&value1Info);
  sources = glu::ProgramSources::operator<<((ProgramSources *)local_320,(ShaderSource *)&value0Info)
  ;
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&value1Info);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_320);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (&outputBuffer0,((this->super_TestCase).m_context)->m_renderCtx);
    GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Out0.values");
    glu::getProgramInterfaceVariableInfo(&value0Info,gl,program.m_program.m_program,0x92e5,GVar2);
    uVar9 = this->m_numValues * value0Info.arrayStride;
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (&outputBuffer1,((this->super_TestCase).m_context)->m_renderCtx);
    GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Out1.values");
    glu::getProgramInterfaceVariableInfo(&value1Info,gl,program.m_program.m_program,0x92e5,GVar2);
    dVar7 = 0;
    if (this->m_isSized != false) {
      dVar7 = this->m_numValues;
    }
    if (value0Info.arraySize == dVar7) {
      if (value1Info.arraySize == value0Info.arraySize) {
        size = this->m_numValues * value1Info.arrayStride;
        local_320._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_01 = (ostringstream *)(local_320 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"Work groups: ");
        tcu::operator<<((ostream *)this_01,&this->m_workSize);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_320,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        (*gl->useProgram)(program.m_program.m_program);
        (*gl->bindBuffer)(0x90d2,outputBuffer0.super_ObjectWrapper.m_object);
        (*gl->bufferData)(0x90d2,(ulong)uVar9,(void *)0x0,0x88e0);
        (*gl->bindBufferBase)(0x90d2,0,outputBuffer0.super_ObjectWrapper.m_object);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"Buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x21f);
        (*gl->bindBuffer)(0x90d2,outputBuffer1.super_ObjectWrapper.m_object);
        (*gl->bufferData)(0x90d2,(ulong)size,(void *)0x0,0x88e0);
        (*gl->bindBufferBase)(0x90d2,1,outputBuffer1.super_ObjectWrapper.m_object);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"Buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x226);
        (*gl->dispatchCompute)
                  ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],
                   (this->m_workSize).m_data[2]);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glDispatchCompute()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                        ,0x22b);
        (*gl->bindBuffer)(0x90d2,outputBuffer0.super_ObjectWrapper.m_object);
        uVar8 = 0;
        BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,uVar9,1);
        local_5e0 = 0;
        while( true ) {
          if ((uint)this->m_numValues <= local_5e0) {
            BufferMemMap::~BufferMemMap(&bufMap);
            (*gl->bindBuffer)(0x90d2,outputBuffer1.super_ObjectWrapper.m_object);
            uVar10 = 0;
            BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,size,1);
            local_5e0 = 0;
            uVar9 = this->m_numValues;
            while( true ) {
              if ((uint)this->m_numValues <= local_5e0) {
                BufferMemMap::~BufferMemMap(&bufMap);
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_PASS,"Pass");
                std::__cxx11::string::~string((string *)&value1Info);
                glu::ObjectWrapper::~ObjectWrapper(&outputBuffer1.super_ObjectWrapper);
                std::__cxx11::string::~string((string *)&value0Info);
                glu::ObjectWrapper::~ObjectWrapper(&outputBuffer0.super_ObjectWrapper);
                glu::ShaderProgram::~ShaderProgram(&program);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
                return STOP;
              }
              res = *(uint *)((long)bufMap.m_ptr + (ulong)uVar10 + (ulong)value1Info.offset);
              ref = uVar9;
              if (uVar9 != res) break;
              local_5e0 = local_5e0 + 1;
              uVar10 = uVar10 + value1Info.arrayStride;
              uVar9 = uVar9 - 1;
            }
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_530,"Comparison failed for Out1.values[",&local_5e9);
            de::toString<unsigned_int>(&local_550,&local_5e0);
            std::operator+(&local_510,&local_530,&local_550);
            std::operator+(&local_4f0,&local_510,"] res=");
            de::toString<unsigned_int>(&local_570,&res);
            std::operator+(&local_4d0,&local_4f0,&local_570);
            std::operator+(&local_4b0,&local_4d0," ref=");
            de::toString<unsigned_int>(&local_590,&ref);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_320,&local_4b0,&local_590);
            tcu::TestError::TestError(pTVar6,(string *)local_320);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          res = *(uint *)((long)bufMap.m_ptr + uVar8 + value0Info.offset);
          ref = local_5e0;
          if (local_5e0 != res) break;
          uVar8 = (ulong)(uint)((int)uVar8 + value0Info.arrayStride);
          local_5e0 = local_5e0 + 1;
        }
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"Comparison failed for Out0.values[",&local_5e9);
        de::toString<unsigned_int>(&local_550,&local_5e0);
        std::operator+(&local_510,&local_530,&local_550);
        std::operator+(&local_4f0,&local_510,"] res=");
        de::toString<unsigned_int>(&local_570,&res);
        std::operator+(&local_4d0,&local_4f0,&local_570);
        std::operator+(&local_4b0,&local_4d0," ref=");
        de::toString<unsigned_int>(&local_590,&ref);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320,&local_4b0,&local_590);
        tcu::TestError::TestError(pTVar6,(string *)local_320);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,(char *)0x0,
                 "value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x213);
    }
    else {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,(char *)0x0,
                 "value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x212);
    }
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x206);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Out0 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out0;\n"
			<< "layout(binding = 1) buffer Out1 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out1;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
			<< "    }\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
			<< "    }\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const Buffer				outputBuffer0	(m_context.getRenderContext());
		const deUint32				value0Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out0.values");
		const InterfaceVariableInfo	value0Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value0Index);
		const deUint32				block0Size		= value0Info.arrayStride*(deUint32)m_numValues;

		const Buffer				outputBuffer1	(m_context.getRenderContext());
		const deUint32				value1Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out1.values");
		const InterfaceVariableInfo	value1Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value1Index);
		const deUint32				block1Size		= value1Info.arrayStride*(deUint32)m_numValues;

		TCU_CHECK(value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));
		TCU_CHECK(value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block0Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block1Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block0Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value0Info.offset + value0Info.arrayStride*ndx));
				const deUint32	ref		= ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out0.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block1Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value1Info.offset + value1Info.arrayStride*ndx));
				const deUint32	ref		= m_numValues - ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out1.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}